

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O0

int xmlParse3986PathRootless(xmlURIPtr uri,char **str)

{
  int iVar1;
  xmlChar *pxVar2;
  char *pcVar3;
  char *pcStack_28;
  int ret;
  char *cur;
  char **str_local;
  xmlURIPtr uri_local;
  
  pcStack_28 = *str;
  cur = (char *)str;
  str_local = &uri->scheme;
  iVar1 = xmlParse3986Segment(&stack0xffffffffffffffd8,'\0',0);
  while( true ) {
    if (iVar1 != 0) {
      return iVar1;
    }
    if (*pcStack_28 != '/') break;
    pcStack_28 = pcStack_28 + 1;
    iVar1 = xmlParse3986Segment(&stack0xffffffffffffffd8,'\0',1);
  }
  if (str_local != (char **)0x0) {
    if (str_local[6] != (char *)0x0) {
      (*xmlFree)(str_local[6]);
    }
    if (pcStack_28 == *(char **)cur) {
      str_local[6] = (char *)0x0;
    }
    else if (((ulong)str_local[9] & 2) == 0) {
      pcVar3 = xmlURIUnescapeString
                         (*(char **)cur,(int)pcStack_28 - (int)*(undefined8 *)cur,(char *)0x0);
      str_local[6] = pcVar3;
    }
    else {
      pxVar2 = xmlStrndup(*(xmlChar **)cur,(int)pcStack_28 - (int)*(undefined8 *)cur);
      str_local[6] = (char *)pxVar2;
    }
  }
  *(char **)cur = pcStack_28;
  return 0;
}

Assistant:

static int
xmlParse3986PathRootless(xmlURIPtr uri, const char **str)
{
    const char *cur;
    int ret;

    cur = *str;

    ret = xmlParse3986Segment(&cur, 0, 0);
    if (ret != 0) return(ret);
    while (*cur == '/') {
        cur++;
	ret = xmlParse3986Segment(&cur, 0, 1);
	if (ret != 0) return(ret);
    }
    if (uri != NULL) {
	if (uri->path != NULL) xmlFree(uri->path);
        if (cur != *str) {
            if (uri->cleanup & 2)
                uri->path = STRNDUP(*str, cur - *str);
            else
                uri->path = xmlURIUnescapeString(*str, cur - *str, NULL);
        } else {
            uri->path = NULL;
        }
    }
    *str = cur;
    return (0);
}